

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O1

void __thiscall Sexp::Finalize(Sexp *this)

{
  pointer ppSVar1;
  LambdaMeaning *pLVar2;
  
  switch(this->kind) {
  case STRING:
    free((this->field_1).cons.car);
    return;
  default:
    PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
              ,0x3c,"Finalize","finalized something that\'s not finalizable!");
  case ACTIVATION:
    pLVar2 = (this->field_1).function.func_meaning;
    if (pLVar2 != (LambdaMeaning *)0x0) {
      ppSVar1 = (((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&pLVar2->arity)->
                super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>)._M_impl.super__Vector_impl_data
                ._M_start;
      if (ppSVar1 != (pointer)0x0) {
        operator_delete(ppSVar1,(long)pLVar2->body - (long)ppSVar1);
      }
LAB_0010ef65:
      operator_delete(pLVar2,0x20);
      return;
    }
    break;
  case FUNCTION:
  case MEANING:
    break;
  case NATIVE_FUNCTION:
    pLVar2 = (LambdaMeaning *)(this->field_1).activation;
    if (pLVar2 != (LambdaMeaning *)0x0) {
      if (*(pointer *)&pLVar2->is_variadic != (pointer)0x0) {
        (*(code *)*(pointer *)&pLVar2->is_variadic)(pLVar2,pLVar2,3);
      }
      goto LAB_0010ef65;
    }
  }
  return;
}

Assistant:

void Sexp::Finalize() {
  if (IsString()) {
    free(const_cast<char *>(this->string_value));
    return;
  }

  if (IsActivation()) {
    delete this->activation;
    return;
  }

  if (IsNativeFunction()) {
    delete this->native_function.func;
    return;
  }

  if (IsFunction()) {
    // TODO this also screws up everything.
    // delete this->function.func_meaning;
    return;
  }

  if (IsMeaning()) {
    // TODO this screws up everything.
    // I'm choosing to leak meanings for now
    // until I figure out how to address this correctly.
    // delete this->meaning;

    return;
  }

  PANIC("finalized something that's not finalizable!");
}